

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeGenerator.cpp
# Opt level: O0

EmitExpressionInfo __thiscall
Js::AsmJSByteCodeGenerator::EmitMathBuiltin
          (AsmJSByteCodeGenerator *this,ParseNode *pnode,AsmJsMathFunction *mathFunction)

{
  ushort argCount_00;
  RegSlot RVar1;
  AsmJsFunc *pAVar2;
  code *pcVar3;
  int iVar4;
  EmitInfoBase EVar5;
  bool bVar6;
  bool bVar7;
  ArgSlot AVar8;
  AsmJSMathBuiltinFunction AVar9;
  RegSlot RVar10;
  RegSlot R1;
  ParseNodeCall *pPVar11;
  ParseNodeFloat *pPVar12;
  ParseNodeInt *pPVar13;
  Memory *pMVar14;
  AsmJsType *pAVar15;
  EmitExpressionInfo *pEVar16;
  AsmJsCompilationException *pAVar17;
  undefined4 *puVar18;
  long lVar19;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar20 [16];
  bool local_272;
  AsmJsType local_160;
  AsmJsType local_15c;
  AsmJsType local_158;
  int local_154;
  AsmJsType local_150;
  int i_2;
  AsmJsType local_148;
  RegSlot dst;
  byte local_13d;
  AsmJsType local_13c;
  bool isFloatish;
  int local_134;
  int iStack_130;
  bool isInt;
  int runtimeArg;
  int argByteSize;
  int i_1;
  bool supported;
  EmitInfoBase EStack_120;
  OpCodeAsmJs op;
  AsmJsRetType retType;
  EmitExpressionInfo *argInfo_1;
  EmitExpressionInfo local_108;
  EmitExpressionInfo *local_100;
  EmitExpressionInfo *argInfo;
  ParseNode *arg;
  code *pcStack_e8;
  ArgSlot i;
  undefined8 local_e0;
  TrackAllocData local_d8;
  code *local_b0;
  undefined8 local_a8;
  TrackAllocData local_a0;
  undefined1 local_68 [8];
  AutoArrayPtr<Js::EmitExpressionInfo> argsInfo;
  AutoArrayPtr<Js::AsmJsType> types;
  float constValue;
  RegSlot dst_1;
  bool isFRound;
  ParseNode *argNode;
  ArgSlot argCount;
  AsmJsMathFunction *mathFunction_local;
  ParseNode *pnode_local;
  AsmJSByteCodeGenerator *this_local;
  EmitExpressionInfo emitInfo;
  
  AVar9 = AsmJsMathFunction::GetMathBuiltInFunction(mathFunction);
  if ((AVar9 == AsmJSMathBuiltin_max) ||
     (AVar9 = AsmJsMathFunction::GetMathBuiltInFunction(mathFunction), AVar9 == AsmJSMathBuiltin_min
     )) {
    this_local = (AsmJSByteCodeGenerator *)EmitMinMax(this,pnode,mathFunction);
  }
  else {
    pPVar11 = ParseNode::AsParseNodeCall(pnode);
    argCount_00 = pPVar11->argCount;
    pPVar11 = ParseNode::AsParseNodeCall(pnode);
    _dst_1 = pPVar11->pnodeArgs;
    bVar6 = AsmJsMathFunction::IsFround(&mathFunction->super_AsmJsFunctionDeclaration);
    if ((argCount_00 == 1) &&
       ((bVar6 && (bVar7 = ParserWrapper::IsFroundNumericLiteral(_dst_1), bVar7)))) {
      StartStatement(this,pnode);
      RVar10 = AsmJsFunc::AcquireTmpRegister<float>(this->mFunction);
      AsmJsType::AsmJsType((AsmJsType *)((long)&types.m_elementCount + 4),Float);
      EmitExpressionInfo::EmitExpressionInfo
                ((EmitExpressionInfo *)&this_local,RVar10,
                 (AsmJsType *)((long)&types.m_elementCount + 4));
      types.m_elementCount._0_4_ = -0.0;
      if (_dst_1->nop == knopFlt) {
        pPVar12 = ParseNode::AsParseNodeFloat(_dst_1);
        types.m_elementCount._0_4_ = (float)pPVar12->dbl;
      }
      else if (_dst_1->nop == knopInt) {
        pPVar13 = ParseNode::AsParseNodeInt(_dst_1);
        types.m_elementCount._0_4_ = (float)pPVar13->lw;
      }
      else {
        bVar6 = ParserWrapper::IsNegativeZero(_dst_1);
        if (!bVar6) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar18 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar18 = 1;
          bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsByteCodeGenerator.cpp"
                                      ,0x4a1,"(ParserWrapper::IsNegativeZero(argNode))",
                                      "ParserWrapper::IsNegativeZero(argNode)");
          if (!bVar6) {
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
          puVar18 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar18 = 0;
        }
      }
      R1 = AsmJsFunc::GetConstRegister<float>(this->mFunction,(float)types.m_elementCount);
      AsmJsByteCodeWriter::AsmReg2(&this->mWriter,Ld_Flt,RVar10,R1);
      EndStatement(this,pnode);
    }
    else {
      AutoArrayPtr<Js::AsmJsType>::AutoArrayPtr
                ((AutoArrayPtr<Js::AsmJsType> *)&argsInfo.m_elementCount,(AsmJsType *)0x0,0);
      AutoArrayPtr<Js::EmitExpressionInfo>::AutoArrayPtr
                ((AutoArrayPtr<Js::EmitExpressionInfo> *)local_68,(EmitExpressionInfo *)0x0,0);
      if (argCount_00 != 0) {
        Memory::TrackAllocData::CreateTrackAllocData
                  (&local_a0,(type_info *)&AsmJsType::typeinfo,0,(ulong)argCount_00,
                   "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsByteCodeGenerator.cpp"
                   ,0x4ac);
        pMVar14 = (Memory *)
                  Memory::HeapAllocator::TrackAllocInfo(&Memory::HeapAllocator::Instance,&local_a0);
        local_b0 = Memory::HeapAllocator::Alloc;
        local_a8 = 0;
        pAVar15 = Memory::AllocateArray<Memory::HeapAllocator,Js::AsmJsType,false>
                            (pMVar14,(HeapAllocator *)Memory::HeapAllocator::Alloc,0,
                             (ulong)argCount_00);
        AutoArrayPtr<Js::AsmJsType>::Set
                  ((AutoArrayPtr<Js::AsmJsType> *)&argsInfo.m_elementCount,pAVar15,(uint)argCount_00
                  );
        Memory::TrackAllocData::CreateTrackAllocData
                  (&local_d8,(type_info *)&EmitExpressionInfo::typeinfo,0,(ulong)argCount_00,
                   "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsByteCodeGenerator.cpp"
                   ,0x4ad);
        pMVar14 = (Memory *)
                  Memory::HeapAllocator::TrackAllocInfo(&Memory::HeapAllocator::Instance,&local_d8);
        pcStack_e8 = Memory::HeapAllocator::Alloc;
        local_e0 = 0;
        pEVar16 = Memory::AllocateArray<Memory::HeapAllocator,Js::EmitExpressionInfo,false>
                            (pMVar14,(HeapAllocator *)Memory::HeapAllocator::Alloc,0,
                             (ulong)argCount_00);
        AutoArrayPtr<Js::EmitExpressionInfo>::Set
                  ((AutoArrayPtr<Js::EmitExpressionInfo> *)local_68,pEVar16,(uint)argCount_00);
        for (arg._6_2_ = 0; arg._6_2_ < argCount_00; arg._6_2_ = arg._6_2_ + 1) {
          argInfo = (EmitExpressionInfo *)_dst_1;
          if ((_dst_1->nop == knopCall) && (bVar6)) {
            AsmJsRetType::AsmJsRetType((AsmJsRetType *)((long)&argInfo_1 + 4),Float);
            local_108 = EmitCall(this,_dst_1,argInfo_1._4_4_);
            local_100 = &local_108;
            pAVar15 = BasePtr::operator_cast_to_AsmJsType_((BasePtr *)&argsInfo.m_elementCount);
            pAVar15[arg._6_2_].which_ = local_108.type.which_;
            pAVar15 = &local_100->type;
            pEVar16 = BasePtr::operator_cast_to_EmitExpressionInfo_((BasePtr *)local_68);
            pEVar16[arg._6_2_].type.which_ = pAVar15->which_;
            RVar1 = (local_100->super_EmitInfoBase).location;
            pEVar16 = BasePtr::operator_cast_to_EmitExpressionInfo_((BasePtr *)local_68);
            pEVar16[arg._6_2_].super_EmitInfoBase.location = RVar1;
          }
          else {
            if (_dst_1->nop == knopList) {
              argInfo = (EmitExpressionInfo *)ParserWrapper::GetBinaryLeft(_dst_1);
              _dst_1 = ParserWrapper::GetBinaryRight(_dst_1);
            }
            _EStack_120 = Emit(this,(ParseNode *)argInfo);
            pAVar15 = BasePtr::operator_cast_to_AsmJsType_((BasePtr *)&argsInfo.m_elementCount);
            pAVar15[arg._6_2_].which_ = retType.which_;
            pEVar16 = BasePtr::operator_cast_to_EmitExpressionInfo_((BasePtr *)local_68);
            pEVar16[arg._6_2_].type.which_ = retType.which_;
            EVar5.location = EStack_120.location;
            pEVar16 = BasePtr::operator_cast_to_EmitExpressionInfo_((BasePtr *)local_68);
            pEVar16[arg._6_2_].super_EmitInfoBase.location = EVar5.location;
          }
        }
      }
      StartStatement(this,pnode);
      AsmJsRetType::AsmJsRetType((AsmJsRetType *)&i_1);
      pAVar15 = BasePtr::operator_cast_to_AsmJsType_((BasePtr *)&argsInfo.m_elementCount);
      argByteSize._1_1_ =
           AsmJsMathFunction::SupportsMathCall
                     (mathFunction,argCount_00,pAVar15,(OpCodeAsmJs *)((long)&argByteSize + 2),
                      (AsmJsRetType *)&i_1);
      if (!(bool)argByteSize._1_1_) {
        pAVar17 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
        AsmJsCompilationException::AsmJsCompilationException
                  (pAVar17,L"Math builtin function doesn\'t support arguments");
        __cxa_throw(pAVar17,&AsmJsCompilationException::typeinfo,0);
      }
      runtimeArg = (int)argCount_00;
      while (runtimeArg = runtimeArg - 1, -1 < runtimeArg) {
        pAVar2 = this->mFunction;
        pEVar16 = BasePtr::operator_cast_to_EmitExpressionInfo_((BasePtr *)local_68);
        AsmJsFunc::ReleaseLocationGeneric(pAVar2,pEVar16 + runtimeArg);
      }
      AVar8 = AsmJsFunctionDeclaration::GetArgByteSize
                        (&mathFunction->super_AsmJsFunctionDeclaration,argCount_00);
      iStack_130 = AVar8 + 8;
      auVar20._0_8_ = (double)((ulong)(long)iStack_130 >> 3);
      auVar20._8_8_ = extraout_XMM0_Qb;
      auVar20 = roundsd(auVar20,auVar20,10);
      local_134 = (int)auVar20._0_8_ + 1;
      AsmJsFunc::UpdateMaxArgOutDepth(this->mFunction,(int)auVar20._0_8_ + 2);
      local_13c = AsmJsRetType::toType((AsmJsRetType *)&i_1);
      isFloatish = AsmJsType::isInt(&local_13c);
      dst = (RegSlot)AsmJsRetType::toType((AsmJsRetType *)&i_1);
      local_13d = AsmJsType::isFloatish((AsmJsType *)&dst);
      local_272 = true;
      if (((isFloatish & 1U) == 0) && (local_272 = true, !(bool)local_13d)) {
        local_148 = AsmJsRetType::toType((AsmJsRetType *)&i_1);
        local_272 = AsmJsType::isDouble(&local_148);
      }
      if (((local_272 ^ 0xffU) & 1) != 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar18 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar18 = 1;
        bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsByteCodeGenerator.cpp"
                                    ,0x4e5,"(isInt || isFloatish || retType.toType().isDouble())",
                                    "isInt || isFloatish || retType.toType().isDouble()");
        if (!bVar6) {
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        puVar18 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar18 = 0;
      }
      if ((isFloatish & 1U) == 0) {
        if ((local_13d & 1) == 0) {
          i_2 = AsmJsFunc::AcquireTmpRegister<double>(this->mFunction);
        }
        else {
          i_2 = AsmJsFunc::AcquireTmpRegister<float>(this->mFunction);
        }
      }
      else {
        i_2 = AsmJsFunc::AcquireTmpRegister<int>(this->mFunction);
      }
      iVar4 = i_2;
      local_150 = AsmJsRetType::toType((AsmJsRetType *)&i_1);
      EmitExpressionInfo::EmitExpressionInfo((EmitExpressionInfo *)&this_local,iVar4,&local_150);
      iVar4 = i_2;
      if (argCount_00 == 1) {
        pEVar16 = BasePtr::operator_cast_to_EmitExpressionInfo_((BasePtr *)local_68);
        AsmJsByteCodeWriter::AsmReg2
                  (&this->mWriter,argByteSize._2_2_,iVar4,(pEVar16->super_EmitInfoBase).location);
      }
      else if (argCount_00 == 2) {
        pEVar16 = BasePtr::operator_cast_to_EmitExpressionInfo_((BasePtr *)local_68);
        RVar10 = (pEVar16->super_EmitInfoBase).location;
        pEVar16 = BasePtr::operator_cast_to_EmitExpressionInfo_((BasePtr *)local_68);
        AsmJsByteCodeWriter::AsmReg3
                  (&this->mWriter,argByteSize._2_2_,iVar4,RVar10,
                   pEVar16[1].super_EmitInfoBase.location);
      }
      else {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar18 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar18 = 1;
        bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsByteCodeGenerator.cpp"
                                    ,0x500,"((0))","(0)");
        if (!bVar6) {
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        puVar18 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar18 = 0;
      }
      for (local_154 = 0; local_154 < (int)(uint)argCount_00; local_154 = local_154 + 1) {
        pEVar16 = BasePtr::operator_cast_to_EmitExpressionInfo_((BasePtr *)local_68);
        lVar19 = (long)local_154;
        AsmJsType::AsmJsType(&local_158,Floatish);
        bVar6 = AsmJsType::isSubType(&pEVar16[lVar19].type,local_158);
        if (bVar6) {
          pAVar2 = this->mFunction;
          pEVar16 = BasePtr::operator_cast_to_EmitExpressionInfo_((BasePtr *)local_68);
          bVar6 = AsmJsFunc::IsValidLocation<float>(pAVar2,pEVar16 + local_154);
          if (!bVar6) {
            pAVar17 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
            pEVar16 = BasePtr::operator_cast_to_EmitExpressionInfo_((BasePtr *)local_68);
            AsmJsCompilationException::AsmJsCompilationException
                      (pAVar17,L"Invalid Node location[%d] ",
                       (ulong)pEVar16[local_154].super_EmitInfoBase.location);
            __cxa_throw(pAVar17,&AsmJsCompilationException::typeinfo,0);
          }
        }
        else {
          pEVar16 = BasePtr::operator_cast_to_EmitExpressionInfo_((BasePtr *)local_68);
          lVar19 = (long)local_154;
          AsmJsType::AsmJsType(&local_15c,MaybeDouble);
          bVar6 = AsmJsType::isSubType(&pEVar16[lVar19].type,local_15c);
          if (bVar6) {
            pAVar2 = this->mFunction;
            pEVar16 = BasePtr::operator_cast_to_EmitExpressionInfo_((BasePtr *)local_68);
            bVar6 = AsmJsFunc::IsValidLocation<double>(pAVar2,pEVar16 + local_154);
            if (!bVar6) {
              pAVar17 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
              pEVar16 = BasePtr::operator_cast_to_EmitExpressionInfo_((BasePtr *)local_68);
              AsmJsCompilationException::AsmJsCompilationException
                        (pAVar17,L"Invalid Node location[%d] ",
                         (ulong)pEVar16[local_154].super_EmitInfoBase.location);
              __cxa_throw(pAVar17,&AsmJsCompilationException::typeinfo,0);
            }
          }
          else {
            pEVar16 = BasePtr::operator_cast_to_EmitExpressionInfo_((BasePtr *)local_68);
            lVar19 = (long)local_154;
            AsmJsType::AsmJsType(&local_160,Intish);
            bVar6 = AsmJsType::isSubType(&pEVar16[lVar19].type,local_160);
            if (bVar6) {
              pAVar2 = this->mFunction;
              pEVar16 = BasePtr::operator_cast_to_EmitExpressionInfo_((BasePtr *)local_68);
              bVar6 = AsmJsFunc::IsValidLocation<int>(pAVar2,pEVar16 + local_154);
              if (!bVar6) {
                pAVar17 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
                pEVar16 = BasePtr::operator_cast_to_EmitExpressionInfo_((BasePtr *)local_68);
                AsmJsCompilationException::AsmJsCompilationException
                          (pAVar17,L"Invalid Node location[%d] ",
                           (ulong)pEVar16[local_154].super_EmitInfoBase.location);
                __cxa_throw(pAVar17,&AsmJsCompilationException::typeinfo,0);
              }
            }
          }
        }
      }
      EndStatement(this,pnode);
      AutoArrayPtr<Js::EmitExpressionInfo>::~AutoArrayPtr
                ((AutoArrayPtr<Js::EmitExpressionInfo> *)local_68);
      AutoArrayPtr<Js::AsmJsType>::~AutoArrayPtr
                ((AutoArrayPtr<Js::AsmJsType> *)&argsInfo.m_elementCount);
    }
  }
  return (EmitExpressionInfo)this_local;
}

Assistant:

EmitExpressionInfo AsmJSByteCodeGenerator::EmitMathBuiltin(ParseNode* pnode, AsmJsMathFunction* mathFunction)
    {
        if (mathFunction->GetMathBuiltInFunction() == AsmJSMathBuiltinFunction::AsmJSMathBuiltin_max || mathFunction->GetMathBuiltInFunction() == AsmJSMathBuiltinFunction::AsmJSMathBuiltin_min)
        {
            return EmitMinMax(pnode, mathFunction);
        }

        const ArgSlot argCount = pnode->AsParseNodeCall()->argCount;
        ParseNode* argNode = pnode->AsParseNodeCall()->pnodeArgs;
        const bool isFRound = AsmJsMathFunction::IsFround(mathFunction);

        // for fround, if we have a fround(NumericLiteral), we want to just emit Ld_Flt NumericLiteral
        if (argCount == 1 && isFRound && ParserWrapper::IsFroundNumericLiteral(argNode))
        {
            StartStatement(pnode);
            RegSlot dst = mFunction->AcquireTmpRegister<float>();
            EmitExpressionInfo emitInfo(dst, AsmJsType::Float);
            float constValue = -0.0f;
            if (argNode->nop == knopFlt)
            {
                constValue = (float)argNode->AsParseNodeFloat()->dbl;
            }
            else if (argNode->nop == knopInt)
            {
                constValue = (float)argNode->AsParseNodeInt()->lw;
            }
            else
            {
                Assert(ParserWrapper::IsNegativeZero(argNode));
            }
            mWriter.AsmReg2(OpCodeAsmJs::Ld_Flt, dst, mFunction->GetConstRegister<float>(constValue));
            EndStatement(pnode);
            return emitInfo;
        }

        AutoArrayPtr<AsmJsType> types(nullptr, 0);
        AutoArrayPtr<EmitExpressionInfo> argsInfo(nullptr, 0);
        if( argCount > 0 )
        {
            types.Set(HeapNewArray(AsmJsType, argCount), argCount);
            argsInfo.Set(HeapNewArray(EmitExpressionInfo, argCount), argCount);

            for(ArgSlot i = 0; i < argCount; i++)
            {
                // Get i arg node
                ParseNode* arg = argNode;
                // Special case for fround(abs()) call
                if (argNode->nop == knopCall && isFRound)
                {
                    // Emit argument
                    const EmitExpressionInfo& argInfo = EmitCall(arg, AsmJsRetType::Float);
                    types[i] = argInfo.type;
                    argsInfo[i].type = argInfo.type;
                    argsInfo[i].location = argInfo.location;
                }
                else
                {
                    if (argNode->nop == knopList)
                    {
                        arg = ParserWrapper::GetBinaryLeft(argNode);
                        argNode = ParserWrapper::GetBinaryRight(argNode);
                    }
                    // Emit argument
                    const EmitExpressionInfo& argInfo = Emit(arg);
                    types[i] = argInfo.type;
                    argsInfo[i].type = argInfo.type;
                    argsInfo[i].location = argInfo.location;
                }
            }
        }
        StartStatement(pnode);
        // Check if this function supports the type of these arguments
        AsmJsRetType retType;
        OpCodeAsmJs op;
        const bool supported = mathFunction->SupportsMathCall( argCount, types, op, retType );
        if( !supported )
        {
            throw AsmJsCompilationException( _u("Math builtin function doesn't support arguments") );
        }

        // Release all used location before acquiring a new tmp register
        for (int i = argCount - 1; i >= 0 ; i--)
        {
            mFunction->ReleaseLocationGeneric( &argsInfo[i] );
        }

        const int argByteSize = mathFunction->GetArgByteSize(argCount) + sizeof(Var);
        // + 1 is for function object
        int runtimeArg = (int)(::ceil((double)(argByteSize / sizeof(Var)))) + 1;

        // Make sure we have enough memory allocated for OutParameters
        // + 1 for return address
        mFunction->UpdateMaxArgOutDepth(runtimeArg + 1);

        const bool isInt = retType.toType().isInt();
        const bool isFloatish = retType.toType().isFloatish();
        Assert(isInt || isFloatish || retType.toType().isDouble());

        RegSlot dst;
        if( isInt )
        {
            dst = mFunction->AcquireTmpRegister<int>();
        }
        else if (isFloatish)
        {
            dst = mFunction->AcquireTmpRegister<float>();
        }
        else
        {
            dst = mFunction->AcquireTmpRegister<double>();
        }

        EmitExpressionInfo emitInfo(dst, retType.toType());

        switch( argCount )
        {
        case 1:
            mWriter.AsmReg2( op, dst, argsInfo[0].location );
            break;
        case 2:
            mWriter.AsmReg3( op, dst, argsInfo[0].location, argsInfo[1].location );
            break;
        default:
            Assume(UNREACHED);
        }
#if DBG
        for (int i = 0; i < argCount; i++)
        {
            if (argsInfo[i].type.isSubType(AsmJsType::Floatish))
            {
                CheckNodeLocation(argsInfo[i], float);
            }
            else if (argsInfo[i].type.isSubType(AsmJsType::MaybeDouble))
            {
                CheckNodeLocation(argsInfo[i], double);
            }
            else if (argsInfo[i].type.isSubType(AsmJsType::Intish))
            {
                CheckNodeLocation(argsInfo[i], int);
            }
        }
#endif
        EndStatement(pnode);
        return emitInfo;
    }